

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O2

REF_STATUS meshb_real(FILE *file,REF_INT version,REF_DBL *real)

{
  size_t sVar1;
  undefined8 uVar2;
  char *pcVar3;
  float temp_float;
  double temp_double;
  
  if (version == 1) {
    sVar1 = fread(&temp_float,4,1,(FILE *)file);
    if (sVar1 != 1) {
      pcVar3 = "read float";
      uVar2 = 0x561;
LAB_001a461b:
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             uVar2,"meshb_real",pcVar3,1,sVar1);
      return 1;
    }
    temp_double = (double)temp_float;
  }
  else {
    sVar1 = fread(&temp_double,8,1,(FILE *)file);
    if (sVar1 != 1) {
      pcVar3 = "read double";
      uVar2 = 0x564;
      goto LAB_001a461b;
    }
  }
  *real = temp_double;
  return 0;
}

Assistant:

static REF_STATUS meshb_real(FILE *file, REF_INT version, REF_DBL *real) {
  float temp_float;
  double temp_double;

  if (1 == version) {
    REIS(1, fread(&temp_float, sizeof(temp_float), 1, file), "read float");
    *real = (REF_DBL)temp_float;
  } else {
    REIS(1, fread(&temp_double, sizeof(temp_double), 1, file), "read double");
    *real = (REF_DBL)temp_double;
  }

  return REF_SUCCESS;
}